

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

void Abc_NtkBalancePerform
               (Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkAig,int fDuplicate,int fSelective,int fUpdateLevel)

{
  uint uVar1;
  bool bVar2;
  FILE *pFile;
  int iVar3;
  Vec_Vec_t *vStorage_00;
  ProgressBar *p;
  Abc_Obj_t *pAVar4;
  int local_7c;
  int local_44;
  Abc_Obj_t *pAStack_40;
  int i;
  Abc_Obj_t *pNode;
  Vec_Vec_t *vStorage;
  ProgressBar *pProgress;
  int fUpdateLevel_local;
  int fSelective_local;
  int fDuplicate_local;
  Abc_Ntk_t *pNtkAig_local;
  Abc_Ntk_t *pNtk_local;
  
  for (local_44 = 0; iVar3 = Abc_NtkCiNum(pNtk), local_44 < iVar3; local_44 = local_44 + 1) {
    pAStack_40 = Abc_NtkCi(pNtk,local_44);
    *(uint *)((long)(pAStack_40->field_6).pTemp + 0x14) =
         *(uint *)((long)(pAStack_40->field_6).pTemp + 0x14) & 0xfff |
         *(uint *)&pAStack_40->field_0x14 & 0xfffff000;
  }
  Abc_NtkSetNodeLevelsArrival(pNtk);
  vStorage_00 = Vec_VecStart(10);
  pFile = _stdout;
  iVar3 = Abc_NtkCoNum(pNtk);
  p = Extra_ProgressBarStart(pFile,iVar3);
  if (pNtk->nBarBufs == 0) {
    for (local_44 = 0; iVar3 = Abc_NtkCoNum(pNtk), local_44 < iVar3; local_44 = local_44 + 1) {
      pAVar4 = Abc_NtkCo(pNtk,local_44);
      Extra_ProgressBarUpdate(p,local_44,(char *)0x0);
      pAVar4 = Abc_ObjFanin0(pAVar4);
      Abc_NodeBalance_rec(pNtkAig,pAVar4,vStorage_00,0,fDuplicate,fSelective,fUpdateLevel);
    }
  }
  else {
    local_44 = 0;
    while( true ) {
      iVar3 = Abc_NtkCoNum(pNtk);
      bVar2 = false;
      if (local_44 < iVar3) {
        if (local_44 < pNtk->nBarBufs) {
          local_7c = Abc_NtkCoNum(pNtk);
          local_7c = local_7c - pNtk->nBarBufs;
        }
        else {
          local_7c = -pNtk->nBarBufs;
        }
        local_7c = local_7c + local_44;
        pAStack_40 = Abc_NtkCo(pNtk,local_7c);
        bVar2 = true;
      }
      if (!bVar2) break;
      Extra_ProgressBarUpdate(p,local_44,(char *)0x0);
      pAVar4 = Abc_ObjFanin0(pAStack_40);
      Abc_NodeBalance_rec(pNtkAig,pAVar4,vStorage_00,0,fDuplicate,fSelective,fUpdateLevel);
      if (local_44 < pNtk->nBarBufs) {
        pAVar4 = Abc_ObjFanin0(pAStack_40);
        uVar1 = *(uint *)&pAVar4->field_0x14;
        pAVar4 = Abc_ObjFanout0(pAStack_40);
        pAVar4 = Abc_ObjFanout0(pAVar4);
        *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xfff | uVar1 & 0xfffff000;
      }
      local_44 = local_44 + 1;
    }
  }
  Extra_ProgressBarStop(p);
  Vec_VecFree(vStorage_00);
  return;
}

Assistant:

void Abc_NtkBalancePerform( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkAig, int fDuplicate, int fSelective, int fUpdateLevel )
{
    ProgressBar * pProgress;
    Vec_Vec_t * vStorage;
    Abc_Obj_t * pNode;
    int i;
    // transfer level
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy->Level = pNode->Level;
    // set the level of PIs of AIG according to the arrival times of the old network
    Abc_NtkSetNodeLevelsArrival( pNtk );
    // allocate temporary storage for supergates
    vStorage = Vec_VecStart( 10 );
    // perform balancing of POs
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkCoNum(pNtk) );
    if ( pNtk->nBarBufs == 0 )
    {
        Abc_NtkForEachCo( pNtk, pNode, i )
        {
            Extra_ProgressBarUpdate( pProgress, i, NULL );
            Abc_NodeBalance_rec( pNtkAig, Abc_ObjFanin0(pNode), vStorage, 0, fDuplicate, fSelective, fUpdateLevel );
        }
    }
    else
    {
        Abc_NtkForEachLiPo( pNtk, pNode, i )
        {
            Extra_ProgressBarUpdate( pProgress, i, NULL );
            Abc_NodeBalance_rec( pNtkAig, Abc_ObjFanin0(pNode), vStorage, 0, fDuplicate, fSelective, fUpdateLevel );
            if ( i < pNtk->nBarBufs )
                Abc_ObjFanout0(Abc_ObjFanout0(pNode))->Level = Abc_ObjFanin0(pNode)->Level;
        }
    }
    Extra_ProgressBarStop( pProgress );
    Vec_VecFree( vStorage );
}